

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O0

int Fra_ClassesCountLits(Fra_Cla_t *p)

{
  int iVar1;
  Aig_Obj_t **pClass_00;
  int local_24;
  int nLits;
  int nNodes;
  int i;
  Aig_Obj_t **pClass;
  Fra_Cla_t *p_local;
  
  local_24 = Vec_PtrSize(p->vClasses1);
  nLits = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vClasses);
    if (iVar1 <= nLits) {
      return local_24;
    }
    pClass_00 = (Aig_Obj_t **)Vec_PtrEntry(p->vClasses,nLits);
    iVar1 = Fra_ClassCount(pClass_00);
    if (iVar1 < 2) break;
    local_24 = iVar1 + -1 + local_24;
    nLits = nLits + 1;
  }
  __assert_fail("nNodes > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                ,0xac,"int Fra_ClassesCountLits(Fra_Cla_t *)");
}

Assistant:

int Fra_ClassesCountLits( Fra_Cla_t * p )
{
    Aig_Obj_t ** pClass;
    int i, nNodes, nLits = 0;
    nLits = Vec_PtrSize( p->vClasses1 );
    Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
    {
        nNodes = Fra_ClassCount( pClass );
        assert( nNodes > 1 );
        nLits += nNodes - 1;
    }
    return nLits;
}